

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Queries::ErrorsTest::testBufferNegativeOffset(ErrorsTest *this)

{
  ostringstream *poVar1;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  GLuint query;
  GLuint buffer;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [384];
  long lVar8;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar2);
  buffer = 0;
  query = 0;
  (**(code **)(lVar8 + 0x6c8))(1);
  dVar3 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar3,"glGenBuffers have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x479);
  (**(code **)(lVar8 + 0x40))(0x8c8e,buffer);
  dVar3 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar3,"glBindBuffers have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x47c);
  (**(code **)(lVar8 + 0x150))(0x8c8e,8,0,0x88ea);
  dVar3 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar3,"glBindBuffers have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x47f);
  (**(code **)(lVar8 + 0x3d8))(0x8914,1,&query);
  dVar3 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar3,"glCreateQueries have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x483);
  (*this->m_pGetQueryBufferObjectiv)(query,buffer,0x8867,-1);
  iVar2 = (**(code **)(lVar8 + 0x800))();
  if (iVar2 != 0x501) {
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "glGetQueryBufferObjectiv called with negative offset generated error ");
    local_1b8.m_getName = glu::getErrorName;
    local_1b8.m_value = iVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,", however GL_INVALID_VALUE was expected.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  (*this->m_pGetQueryBufferObjectuiv)(query,buffer,0x8867,-1);
  iVar4 = (**(code **)(lVar8 + 0x800))();
  if (iVar4 != 0x501) {
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "glGetQueryBufferObjectuiv called with negative offset generated error ");
    local_1b8.m_getName = glu::getErrorName;
    local_1b8.m_value = iVar4;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,", however GL_INVALID_VALUE was expected.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  (*this->m_pGetQueryBufferObjecti64v)(query,buffer,0x8867,-1);
  iVar5 = (**(code **)(lVar8 + 0x800))();
  if (iVar5 != 0x501) {
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "glGetQueryBufferObjecti64v called with negative offset generated error ");
    local_1b8.m_getName = glu::getErrorName;
    local_1b8.m_value = iVar5;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,", however GL_INVALID_VALUE was expected.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  (*this->m_pGetQueryBufferObjectui64v)(query,buffer,0x8867,-1);
  iVar6 = (**(code **)(lVar8 + 0x800))();
  if (iVar6 != 0x501) {
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "glGetQueryBufferObjectui64v called with negative offset generated error ");
    local_1b8.m_getName = glu::getErrorName;
    local_1b8.m_value = iVar6;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,", however GL_INVALID_VALUE was expected.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  if (query != 0) {
    (**(code **)(lVar8 + 0x458))(1,&query);
  }
  if (buffer != 0) {
    (**(code **)(lVar8 + 0x438))(1,&buffer);
  }
  do {
    iVar7 = (**(code **)(lVar8 + 0x800))();
  } while (iVar7 != 0);
  return iVar6 == 0x501 && (iVar5 == 0x501 && (iVar4 == 0x501 && iVar2 == 0x501));
}

Assistant:

bool ErrorsTest::testBufferNegativeOffset()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Default result. */
	bool is_ok	= true;
	bool is_error = false;

	/* Test's objects. */
	glw::GLuint buffer = 0;
	glw::GLuint query  = 0;

	try
	{
		/* Creating buffer for the test. */
		gl.genBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers have failed");

		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffers have failed");

		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, sizeof(glw::GLint64), DE_NULL, GL_DYNAMIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffers have failed");

		/* Create query object for the test. */
		gl.createQueries(s_targets[0], 1, &query);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateQueries have failed");

		/* Test query with negative offset (integer version). */
		m_pGetQueryBufferObjectiv(query, buffer, GL_QUERY_RESULT_AVAILABLE, -1);

		glw::GLenum error = gl.getError();

		if (GL_INVALID_VALUE != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "glGetQueryBufferObjectiv called with negative offset generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_VALUE was expected." << tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test query with negative offset (unsigned integer version). */
		m_pGetQueryBufferObjectuiv(query, buffer, GL_QUERY_RESULT_AVAILABLE, -1);

		error = gl.getError();

		if (GL_INVALID_VALUE != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "glGetQueryBufferObjectuiv called with negative offset generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_VALUE was expected." << tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test query with negative offset (64-bit integer version). */
		m_pGetQueryBufferObjecti64v(query, buffer, GL_QUERY_RESULT_AVAILABLE, -1);

		error = gl.getError();

		if (GL_INVALID_VALUE != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "glGetQueryBufferObjecti64v called with negative offset generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_VALUE was expected." << tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test query with negative offset (64-bit unsigned integer version). */
		m_pGetQueryBufferObjectui64v(query, buffer, GL_QUERY_RESULT_AVAILABLE, -1);

		error = gl.getError();

		if (GL_INVALID_VALUE != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "glGetQueryBufferObjectui64v called with negative offset generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_VALUE was expected." << tcu::TestLog::EndMessage;

			is_ok = false;
		}
	}
	catch (...)
	{
		is_error = true;
	}

	/* Releasing objects. */
	if (query)
	{
		gl.deleteQueries(1, &query);
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);
	}

	/* Error cleanup. */
	while (gl.getError())
		;

	if (is_error)
	{
		throw 0;
	}

	return is_ok;
}